

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_deviceIntegration> *this)

{
  int *piVar1;
  QDebug this_00;
  Data *pDVar2;
  char cVar3;
  iterator iVar4;
  QLoggingCategory *pQVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QStringView QVar12;
  value_type v;
  QDebug local_e0;
  QString local_d8;
  QString local_b8;
  char *local_a0;
  QDebug local_98;
  QtPrivate local_90 [8];
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>::instance()
  ::holder = (QEglFSDeviceIntegration *)0x0;
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QEglFSDeviceIntegrationFactory::keys();
  if ((undefined1 *)local_68.size == (undefined1 *)0x0) goto LAB_0011ae8b;
  cVar3 = qEnvironmentVariableIsSet("DISPLAY");
  if (cVar3 == '\0') {
    pcVar6 = L"eglfs_kms";
  }
  else {
    pcVar6 = L"eglfs_x11";
  }
  local_b8.d.d._4_4_ = 0;
  local_b8.d.d._0_4_ = 0;
  local_b8.d.ptr._0_4_ = SUB84(pcVar6,0);
  local_b8.d.ptr._4_4_ = 0;
  local_b8.d.size._0_4_ = 9;
  local_b8.d.size._4_4_ = 0;
  QVar7.m_data = pcVar6;
  QVar7.m_size = 9;
  cVar3 = QtPrivate::QStringList_contains((QList *)&local_68,QVar7,CaseSensitive);
  if (cVar3 != '\0') {
    QtPrivate::sequential_erase_one<QList<QString>,QString>((QList<QString> *)&local_68,&local_b8);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_68,0,&local_b8);
  }
  piVar1 = (int *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_),2,0x10);
    }
  }
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)&local_88);
  pDVar2 = local_88.d.d;
  if (local_88.d.ptr == (storage_type_conflict *)0x0) {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = L"eglfs_kms";
    local_88.d.size = 9;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
      goto LAB_0011ab34;
    }
LAB_0011abaa:
    QtPrivate::sequential_erase_one<QList<QString>,QString>((QList<QString> *)&local_68,&local_88);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_68,0,&local_88);
LAB_0011abcf:
    pQVar5 = QtPrivateLogging::qLcEglDevDebug();
    if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_a0 = pQVar5->name;
      local_b8.d.d._0_4_ = 2;
      local_b8.d.d._4_4_ = 0;
      local_b8.d.ptr._0_4_ = 0;
      local_b8.d.ptr._4_4_ = 0;
      local_b8.d.size._0_4_ = 0;
      local_b8.d.size._4_4_ = 0;
      QMessageLogger::debug();
      pDVar2 = local_d8.d.d;
      QVar9.m_data = (storage_type *)0x2c;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)pDVar2,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_d8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_d8.d.d,' ');
      }
      *(int *)&local_d8.d.d[2].super_QArrayData.alloc =
           (int)local_d8.d.d[2].super_QArrayData.alloc + 1;
      local_98.stream = (Stream *)0x0;
      local_50.d.d = local_d8.d.d;
      QtPrivate::printSequentialContainer<QList<QString>>
                (local_90,(Stream *)&local_50,"QList",(QList<QString> *)&local_68);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug((QDebug *)local_90);
      QDebug::~QDebug(&local_98);
      QDebug::~QDebug((QDebug *)&local_d8);
    }
    if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>::
        instance()::holder == (QEglFSDeviceIntegration *)0x0) {
      do {
        if ((undefined1 *)local_68.size == (undefined1 *)0x0) break;
        local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        iVar4 = QList<QString>::begin((QList<QString> *)&local_68);
        local_d8.d.d = ((iVar4.i)->d).d;
        local_d8.d.ptr = ((iVar4.i)->d).ptr;
        ((iVar4.i)->d).d = (Data *)0x0;
        ((iVar4.i)->d).ptr = (char16_t *)0x0;
        local_d8.d.size = ((iVar4.i)->d).size;
        ((iVar4.i)->d).size = 0;
        QtPrivate::QGenericArrayOps<QString>::eraseFirst((QGenericArrayOps<QString> *)&local_68);
        pQVar5 = QtPrivateLogging::qLcEglDevDebug();
        if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_a0 = pQVar5->name;
          local_b8.d.d._0_4_ = 2;
          local_b8.d.d._4_4_ = 0;
          local_b8.d.ptr._0_4_ = 0;
          local_b8.d.ptr._4_4_ = 0;
          local_b8.d.size._0_4_ = 0;
          local_b8.d.size._4_4_ = 0;
          QMessageLogger::debug();
          this_00.stream = local_e0.stream;
          QVar10.m_data = (storage_type *)0x25;
          QVar10.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar10);
          QTextStream::operator<<((QTextStream *)this_00.stream,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_e0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_e0.stream,' ');
          }
          pcVar6 = local_d8.d.ptr;
          if (local_d8.d.ptr == (char16_t *)0x0) {
            pcVar6 = (char16_t *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_e0,(ulong)pcVar6);
          if (*(QTextStream *)(local_e0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_e0.stream,' ');
          }
          QDebug::~QDebug(&local_e0);
        }
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>::
        instance()::holder = QEglFSDeviceIntegrationFactory::create(&local_d8);
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
      } while (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>
               ::instance()::holder == (QEglFSDeviceIntegration *)0x0);
    }
  }
  else {
LAB_0011ab34:
    if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) goto LAB_0011abcf;
    if (((undefined1 *)local_88.d.size != (undefined1 *)0x4) ||
       (QVar8.m_data = local_88.d.ptr, QVar8.m_size = 4, QVar12.m_data = L"none", QVar12.m_size = 4,
       cVar3 = QtPrivate::equalStrings(QVar8,QVar12), cVar3 == '\0')) goto LAB_0011abaa;
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0011ae8b:
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>::
      instance()::holder == (QEglFSDeviceIntegration *)0x0) {
    pQVar5 = QtPrivateLogging::qLcEglDevDebug();
    if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_a0 = pQVar5->name;
      local_b8.d.d._0_4_ = 2;
      local_b8.d.d._4_4_ = 0;
      local_b8.d.ptr._0_4_ = 0;
      local_b8.d.ptr._4_4_ = 0;
      local_b8.d.size._0_4_ = 0;
      local_b8.d.size._4_4_ = 0;
      QMessageLogger::debug();
      pDVar2 = local_88.d.d;
      QVar11.m_data = (storage_type *)0x1d;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)pDVar2,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_88.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_88.d.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_88);
    }
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>::
    instance()::holder = (QEglFSDeviceIntegration *)operator_new(8);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>>::
    instance()::holder->_vptr_QEglFSDeviceIntegration =
         (_func_int **)&PTR__QEglFSDeviceIntegration_00144990;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  guard._q_value.super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }